

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseCharRef(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  int val;
  xmlChar *pxVar6;
  char *msg;
  xmlParserErrors error;
  uint uVar7;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (pxVar2 = ctxt->input, pxVar2 == (xmlParserInputPtr)0x0))
  {
    msg = "htmlParseCharRef: context error\n";
    error = XML_ERR_INTERNAL_ERROR;
    goto LAB_0014b061;
  }
  pxVar6 = pxVar2->cur;
  if (*pxVar6 == '&') {
    if ((pxVar6[1] == '#') && ((pxVar6[2] | 0x20) == 0x78)) {
      pxVar2->cur = pxVar6 + 3;
      pxVar2->col = pxVar2->col + 3;
      xVar1 = *ctxt->input->cur;
      pxVar6 = (xmlChar *)CONCAT71((int7)((ulong)(pxVar6 + 3) >> 8),xVar1);
      uVar7 = 0;
      if (xVar1 != ';') {
        uVar7 = 0;
        do {
          cVar5 = (char)pxVar6;
          uVar4 = (uint)pxVar6 & 0xff;
          if ((byte)(cVar5 - 0x30U) < 10) {
            if ((int)uVar7 < 0x110000) {
              uVar7 = (uVar7 * 0x10 + uVar4) - 0x30;
            }
          }
          else if ((byte)(cVar5 + 0x9fU) < 6) {
            if ((int)uVar7 < 0x110000) {
              uVar7 = (uVar7 * 0x10 + uVar4) - 0x57;
            }
          }
          else {
            pxVar6 = (xmlChar *)CONCAT71((int7)((ulong)pxVar6 >> 8),cVar5 + 0xbfU);
            if (5 < (byte)(cVar5 + 0xbfU)) {
              pxVar6 = (xmlChar *)0x0;
              htmlParseErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,"htmlParseCharRef: missing semicolon\n",
                           (xmlChar *)0x0,(xmlChar *)0x0);
              break;
            }
            if ((int)uVar7 < 0x110000) {
              uVar7 = (uVar7 * 0x10 + uVar4) - 0x37;
            }
          }
          xmlNextChar(ctxt);
          xVar1 = *ctxt->input->cur;
          pxVar6 = (xmlChar *)CONCAT71((int7)((ulong)pxVar6 >> 8),xVar1);
        } while (xVar1 != ';');
      }
    }
    else {
      if (pxVar6[1] != '#') goto LAB_0014b0e4;
      pxVar6 = pxVar6 + 2;
      pxVar2->cur = pxVar6;
      pxVar2->col = pxVar2->col + 2;
      bVar3 = *ctxt->input->cur;
      uVar7 = 0;
      if (bVar3 != 0x3b) {
        uVar7 = 0;
        do {
          if (9 < (byte)(bVar3 - 0x30)) {
            pxVar6 = (xmlChar *)0x0;
            htmlParseErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,"htmlParseCharRef: missing semicolon\n",
                         (xmlChar *)0x0,(xmlChar *)0x0);
            break;
          }
          pxVar6 = (xmlChar *)(ulong)(uVar7 * 5);
          uVar4 = (bVar3 - 0x30) + uVar7 * 10;
          if (0x10ffff < (int)uVar7) {
            uVar4 = uVar7;
          }
          uVar7 = uVar4;
          xmlNextChar(ctxt);
          bVar3 = *ctxt->input->cur;
        } while (bVar3 != 0x3b);
      }
    }
    val = (int)pxVar6;
    if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
    }
  }
  else {
LAB_0014b0e4:
    uVar7 = 0;
    val = 0;
    htmlParseErr(ctxt,XML_ERR_INVALID_CHARREF,"htmlParseCharRef: invalid value\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  if ((int)uVar7 < 0x100) {
    if (0x1f < (int)uVar7) {
      return uVar7;
    }
    if ((uVar7 < 0xe) && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0)) {
      return uVar7;
    }
  }
  else {
    uVar4 = uVar7 - 0xe000;
    val = CONCAT31((int3)(uVar4 >> 8),uVar4 < 0x1ffe);
    if ((uVar7 - 0x10000 < 0x100000 || uVar4 < 0x1ffe) || (int)uVar7 < 0xd800) {
      return uVar7;
    }
  }
  if ((int)uVar7 < 0x110000) {
    htmlParseErrInt(ctxt,0x1f58b5,(char *)(ulong)uVar7,val);
    return 0;
  }
  msg = "htmlParseCharRef: value too large\n";
  error = XML_ERR_INVALID_CHAR;
LAB_0014b061:
  htmlParseErr(ctxt,error,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  return 0;
}

Assistant:

int
htmlParseCharRef(htmlParserCtxtPtr ctxt) {
    int val = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseCharRef: context error\n",
		     NULL, NULL);
        return(0);
    }
    if ((CUR == '&') && (NXT(1) == '#') &&
        ((NXT(2) == 'x') || NXT(2) == 'X')) {
	SKIP(3);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - '0');
            } else if ((CUR >= 'a') && (CUR <= 'f')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'a') + 10;
            } else if ((CUR >= 'A') && (CUR <= 'F')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'A') + 10;
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_HEX_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else if  ((CUR == '&') && (NXT(1) == '#')) {
	SKIP(2);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 10 + (CUR - '0');
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_DEC_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHARREF,
	             "htmlParseCharRef: invalid value\n", NULL, NULL);
    }
    /*
     * Check the value IS_CHAR ...
     */
    if (IS_CHAR(val)) {
        return(val);
    } else if (val >= 0x110000) {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHAR,
		     "htmlParseCharRef: value too large\n", NULL, NULL);
    } else {
	htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
			"htmlParseCharRef: invalid xmlChar value %d\n",
			val);
    }
    return(0);
}